

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathLibrary.cpp
# Opt level: O2

Var Js::Math::Ceil(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  uint uVar5;
  undefined4 *puVar6;
  void *aValue;
  Var pvVar7;
  long nValue;
  CallInfo value;
  undefined8 extraout_XMM0_Qb;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int in_stack_00000010;
  undefined1 local_58 [8];
  ArgumentReader args;
  CallInfo local_30;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_30 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                ,0x156,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00bd55b3;
    *puVar6 = 0;
  }
  ArgumentReader::ArgumentReader((ArgumentReader *)local_58,&local_30,(Var *)&stack0x00000018);
  if ((local_58._0_4_ & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                ,0x157,"(args.Info.Count > 0)",
                                "Should always have implicit \'this\'");
    if (!bVar3) goto LAB_00bd55b3;
    *puVar6 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_30 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                ,0x15a,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00bd55b3;
    *puVar6 = 0;
  }
  if ((local_58._0_4_ & 0xfffffe) == 0) {
    aValue = (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             nan.ptr;
  }
  else {
    aValue = Arguments::operator[]((Arguments *)local_58,1);
    bVar3 = TaggedInt::Is(aValue);
    if (!bVar3) {
      callInfo_local = (CallInfo)JavascriptConversion::ToNumber(aValue,pSVar1);
      BVar4 = AutoSystemInfo::SSE4_1Available(&AutoSystemInfo::Data);
      if (BVar4 == 0) {
        auVar8 = roundsd(extraout_XMM0,callInfo_local,10);
        value = auVar8._0_8_;
        nValue = (long)(double)value;
        if (((int)nValue == nValue) &&
           (callInfo_local = value, BVar4 = JavascriptNumber::IsNegZero((double)value),
           value = callInfo_local, BVar4 == 0)) {
          pvVar7 = JavascriptNumber::ToVar(nValue,pSVar1);
          return pvVar7;
        }
      }
      else {
        auVar8._8_8_ = 0;
        auVar8._0_8_ = callInfo_local;
        auVar8 = roundsd(auVar8,auVar8,2);
        uVar5 = (uint)ROUND(auVar8._0_8_);
        if ((uVar5 & 0x7fffffff) != 0) {
          return (Var)((ulong)uVar5 | 0x1000000000000);
        }
        if ((uVar5 == 0) &&
           (unique0x100003da = auVar8, BVar4 = JavascriptNumber::IsNegZero(auVar8._0_8_),
           auVar8 = stack0xffffffffffffffb8, BVar4 == 0)) {
          return &DAT_1000000000000;
        }
        auVar9._8_8_ = extraout_XMM0_Qb;
        auVar9._0_8_ = callInfo_local;
        auVar9 = roundsd(auVar9,auVar9,10);
        value = auVar8._0_8_;
        if (((double)value != auVar9._0_8_) || (NAN((double)value) || NAN(auVar9._0_8_))) {
          unique0x100003ea = auVar8;
          BVar4 = JavascriptNumber::IsNan((double)value);
          value = (CallInfo)args.super_Arguments.Values;
          if (BVar4 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar6 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                        ,0x180,
                                        "(dblResult == ::ceil(x) || Js::JavascriptNumber::IsNan(dblResult))"
                                        ,
                                        "dblResult == ::ceil(x) || Js::JavascriptNumber::IsNan(dblResult)"
                                       );
            if (!bVar3) {
LAB_00bd55b3:
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            *puVar6 = 0;
            value = (CallInfo)args.super_Arguments.Values;
          }
        }
      }
      aValue = JavascriptNumber::ToVarNoCheck((double)value,pSVar1);
    }
  }
  return aValue;
}

Assistant:

Var Math::Ceil(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count >= 2)
        {
            Var inputArg = args[1];

            if (TaggedInt::Is(inputArg))
            {
                return inputArg;
            }

            double x = JavascriptConversion::ToNumber(inputArg, scriptContext);
#if defined(_M_ARM32_OR_ARM64)
            if (Js::JavascriptNumber::IsNan(x))
            {
                return scriptContext->GetLibrary()->GetNaN();
            }
#endif

#if (defined(_M_IX86) || defined(_M_X64)) \
    && (__SSE4_1__ || _WIN32) // _mm_ceil_sd needs this
            if (AutoSystemInfo::Data.SSE4_1Available())
            {
                __m128d input, output;
                input = _mm_load_sd(&x);
                output = _mm_ceil_sd(input, input);
                int intResult = _mm_cvtsd_si32(output);

                if (TaggedInt::IsOverflow(intResult) || intResult == 0 || intResult == 0x80000000)
                {
                    double dblResult;
                    _mm_store_sd(&dblResult, output);

                    if (intResult == 0 && !JavascriptNumber::IsNegZero(dblResult))
                    {
                        return JavascriptNumber::ToVar(0, scriptContext);
                    }

                    Assert(dblResult == ::ceil(x) || Js::JavascriptNumber::IsNan(dblResult));

                    return JavascriptNumber::ToVarNoCheck(dblResult, scriptContext);
                }
                else
                {
                    return JavascriptNumber::ToVar(intResult, scriptContext);
                }
            }
            else
#endif
            {
                double result = ::ceil(x);

                intptr_t intResult = (intptr_t)result;

                if (TaggedInt::IsOverflow(intResult) || JavascriptNumber::IsNegZero(result))
                {
                    return JavascriptNumber::ToVarNoCheck(result, scriptContext);
                }
                else
                {
                    return JavascriptNumber::ToVar(intResult, scriptContext);
                }
            }
        }
        else
        {
            return scriptContext->GetLibrary()->GetNaN();
        }
    }